

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::printReference(Collimator *this)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  void *this_00;
  long in_RDI;
  key_type_conflict *in_stack_00000018;
  int i;
  int local_c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Reference list");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x1b0); local_c = local_c + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_c);
    poVar1 = std::operator<<(poVar1," ");
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                           *)this,in_stack_00000018);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pmVar2->first);
    poVar1 = std::operator<<(poVar1,",");
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                           *)this,in_stack_00000018);
    this_00 = (void *)std::ostream::operator<<(poVar1,pmVar2->second);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Collimator::printReference () {
    cout << "Reference list" << endl;
    for (int i=0; i < ref_size; i++) {
      cout << i << " " << reference[i].first << "," << reference[i].second << endl;
    }
  }